

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minicrypto.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ptls_iovec_t key_00;
  undefined1 local_a0 [8];
  ptls_context_t ctxbuf;
  ptls_iovec_t cert;
  ptls_iovec_t key;
  ptls_minicrypto_lookup_certificate_t lookup_certificate;
  char **argv_local;
  int argc_local;
  
  subtest("secp256r1",test_secp256r1_key_exchange);
  subtest("x25519",test_x25519_key_exchange);
  subtest("secp256r1-sign",test_secp256r1_sign);
  key_00 = ptls_iovec_init(anon_var_dwarf_9b84,0x20);
  join_0x00000010_0x00000000_ = ptls_iovec_init(anon_var_dwarf_9b9a,0x19b);
  ptls_minicrypto_init_lookup_certificate((ptls_minicrypto_lookup_certificate_t *)&key.len);
  ptls_minicrypto_lookup_certificate_add_identity
            ((ptls_minicrypto_lookup_certificate_t *)&key.len,"example.com",0x403,key_00,
             (ptls_iovec_t *)&ctxbuf.save_ticket,1);
  local_a0 = (undefined1  [8])ptls_minicrypto_random_bytes;
  ctxbuf.random_bytes = (_func_void_void_ptr_size_t *)ptls_minicrypto_key_exchanges;
  ctxbuf.key_exchanges = (ptls_key_exchange_algorithm_t **)ptls_minicrypto_cipher_suites;
  ctxbuf.cipher_suites = (ptls_cipher_suite_t **)&key.len;
  ctxbuf.lookup_certificate = (ptls_lookup_certificate_t *)0x0;
  ctxbuf.verify_certificate._0_4_ = 0;
  ctxbuf.verify_certificate._4_4_ = 0;
  ctxbuf.ticket_lifetime = 0;
  ctxbuf.require_dhe_on_psk = 0;
  ctxbuf._52_4_ = 0;
  ctxbuf.encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
  ctxbuf.decrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
  ctx_peer = (ptls_context_t *)local_a0;
  ctx = (ptls_context_t *)local_a0;
  subtest("picotls",test_picotls);
  iVar1 = done_testing();
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    subtest("secp256r1", test_secp256r1_key_exchange);
    subtest("x25519", test_x25519_key_exchange);
    subtest("secp256r1-sign", test_secp256r1_sign);

    ptls_minicrypto_lookup_certificate_t lookup_certificate;
    ptls_iovec_t key = ptls_iovec_init(SECP256R1_PRIVATE_KEY, sizeof(SECP256R1_PRIVATE_KEY) - 1),
                 cert = ptls_iovec_init(SECP256R1_CERTIFICATE, sizeof(SECP256R1_CERTIFICATE) - 1);
    ptls_minicrypto_init_lookup_certificate(&lookup_certificate);
    ptls_minicrypto_lookup_certificate_add_identity(&lookup_certificate, "example.com", PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256, key,
                                                    &cert, 1);

    ptls_context_t ctxbuf = {ptls_minicrypto_random_bytes, ptls_minicrypto_key_exchanges, ptls_minicrypto_cipher_suites,
                             &lookup_certificate.super};
    ctx = ctx_peer = &ctxbuf;

    subtest("picotls", test_picotls);

    return done_testing();
    return done_testing();
}